

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::createCache(QNetworkReplyImplPrivate *this)

{
  char cVar1;
  QAbstractNetworkCache *pQVar2;
  long in_FS_OFFSET;
  QVariant local_70;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = networkCache(this);
  if (pQVar2 != (QAbstractNetworkCache *)0x0) {
    QVariant::QVariant(&local_70,true);
    QNetworkRequest::attribute
              (&local_50,&(this->super_QNetworkReplyPrivate).request,CacheSaveControlAttribute,
               &local_70);
    cVar1 = QVariant::toBool();
    QVariant::~QVariant(&local_50);
    QVariant::~QVariant(&local_70);
    if (cVar1 != '\0') {
      this->cacheEnabled = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::createCache()
{
    // check if we can save and if we're allowed to
    if (!networkCache()
        || !request.attribute(QNetworkRequest::CacheSaveControlAttribute, true).toBool())
        return;
    cacheEnabled = true;
}